

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BgzfStream::ReadBlock(BgzfStream *this)

{
  undefined8 *puVar1;
  bool bVar2;
  unsigned_short uVar3;
  undefined8 uVar4;
  string *where;
  size_t sVar5;
  int *in_RDI;
  size_t newBlockLength;
  string message_1;
  size_t remaining;
  size_t blockLength;
  string message;
  int64_t numBytesRead;
  char header [18];
  int64_t blockAddress;
  char *in_stack_fffffffffffffcb0;
  allocator *paVar6;
  string *in_stack_fffffffffffffce0;
  string *message_00;
  string *in_stack_fffffffffffffce8;
  BamException *in_stack_fffffffffffffcf0;
  BamException *this_00;
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [38];
  undefined1 local_25a;
  allocator local_259;
  string local_258 [32];
  string local_238 [39];
  allocator local_211;
  string local_210 [64];
  ulong local_1d0;
  undefined1 local_1c2;
  undefined1 local_1c1 [41];
  size_t *in_stack_fffffffffffffe68;
  BgzfStream *in_stack_fffffffffffffe70;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [38];
  undefined1 local_11a;
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [38];
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [55];
  allocator local_71;
  string local_70 [64];
  ulong local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined2 local_18 [4];
  undefined8 local_10;
  
  bamtools_noop();
  local_10 = (**(code **)(**(long **)(in_RDI + 6) + 0x38))();
  local_30 = (**(code **)(**(long **)(in_RDI + 6) + 0x28))(*(long **)(in_RDI + 6),&local_28,0x12);
  if ((long)local_30 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"device error: ",&local_71);
    (**(code **)(**(long **)(in_RDI + 6) + 0x48))(local_a8);
    std::operator+(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    local_ca = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"BgzfStream::ReadBlock",&local_c9);
    BamException::BamException
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
    local_ca = 0;
    __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
  }
  if (local_30 == 0) {
    *in_RDI = 0;
  }
  else {
    if (local_30 != 0x12) {
      local_11a = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"BgzfStream::ReadBlock",&local_f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"invalid block header size",&local_119);
      BamException::BamException
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
      local_11a = 0;
      __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
    }
    bVar2 = CheckBlockHeader(in_stack_fffffffffffffcb0);
    if (!bVar2) {
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"BgzfStream::ReadBlock",&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,"invalid block header contents",&local_169);
      BamException::BamException
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
      __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
    }
    uVar3 = UnpackUnsignedShort((char *)local_18);
    puVar1 = *(undefined8 **)(in_RDI + 0xc);
    *puVar1 = local_28;
    puVar1[1] = local_20;
    *(undefined2 *)(puVar1 + 2) = local_18[0];
    if ((ulong)(long)(int)(uVar3 + 1) < 0x12) {
      local_1c2 = 1;
      where = (string *)__cxa_allocate_exception(0x28);
      this_00 = (BamException *)(local_1c1 + 0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffe68,"BgzfStream::ReadBlock",(allocator *)this_00);
      message_00 = (string *)local_1c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1c1 + 1),"invalid BSIZE",(allocator *)message_00);
      BamException::BamException(this_00,where,message_00);
      local_1c2 = 0;
      __cxa_throw(where,&BamException::typeinfo,BamException::~BamException);
    }
    local_1d0 = (long)(int)(uVar3 + 1) - 0x12;
    local_30 = (**(code **)(**(long **)(in_RDI + 6) + 0x28))
                         (*(long **)(in_RDI + 6),*(long *)(in_RDI + 0xc) + 0x12,
                          local_1d0 & 0xffffffff);
    if ((long)local_30 < 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"device error: ",&local_211);
      (**(code **)(**(long **)(in_RDI + 6) + 0x48))(local_238);
      std::operator+(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      local_25a = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,"BgzfStream::ReadBlock",&local_259);
      BamException::BamException
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
      local_25a = 0;
      __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
    }
    if (local_30 != local_1d0) {
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"BgzfStream::ReadBlock",&local_281);
      paVar6 = &local_2a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8,"could not read data from block",paVar6);
      BamException::BamException
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
      __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
    }
    sVar5 = InflateBlock(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    if (*in_RDI != 0) {
      in_RDI[1] = 0;
    }
    *(undefined8 *)(in_RDI + 2) = local_10;
    *in_RDI = (int)sVar5;
  }
  return;
}

Assistant:

void BgzfStream::ReadBlock()
{

    BT_ASSERT_X(m_device, "BgzfStream::ReadBlock() - trying to read from null IO device");

    // store block's starting address
    const int64_t blockAddress = m_device->Tell();

    // read block header from file
    char header[Constants::BGZF_BLOCK_HEADER_LENGTH];
    int64_t numBytesRead = m_device->Read(header, Constants::BGZF_BLOCK_HEADER_LENGTH);

    // check for device error
    if (numBytesRead < 0) {
        const std::string message = std::string("device error: ") + m_device->GetErrorString();
        throw BamException("BgzfStream::ReadBlock", message);
    }

    // if block header empty
    if (numBytesRead == 0) {
        m_blockLength = 0;
        return;
    }

    // if block header invalid size
    if (numBytesRead != static_cast<int8_t>(Constants::BGZF_BLOCK_HEADER_LENGTH)) {
        throw BamException("BgzfStream::ReadBlock", "invalid block header size");
    }

    // validate block header contents
    if (!BgzfStream::CheckBlockHeader(header)) {
        throw BamException("BgzfStream::ReadBlock", "invalid block header contents");
    }

    // copy header contents to compressed buffer
    const std::size_t blockLength = BamTools::UnpackUnsignedShort(&header[16]) + 1;
    std::memcpy(m_compressedBlock.Buffer, header, Constants::BGZF_BLOCK_HEADER_LENGTH);

    // read remainder of block
    if (blockLength < Constants::BGZF_BLOCK_HEADER_LENGTH) {
        throw BamException("BgzfStream::ReadBlock", "invalid BSIZE");
    }

    const std::size_t remaining = blockLength - Constants::BGZF_BLOCK_HEADER_LENGTH;
    numBytesRead =
        m_device->Read(&m_compressedBlock.Buffer[Constants::BGZF_BLOCK_HEADER_LENGTH], remaining);

    // check for device error
    if (numBytesRead < 0) {
        const std::string message = std::string("device error: ") + m_device->GetErrorString();
        throw BamException("BgzfStream::ReadBlock", message);
    }

    // check that we read in expected numBytes
    if (numBytesRead != static_cast<int64_t>(remaining)) {
        throw BamException("BgzfStream::ReadBlock", "could not read data from block");
    }

    // decompress block data
    const std::size_t newBlockLength = InflateBlock(blockLength);

    // update block data
    if (m_blockLength != 0) {
        m_blockOffset = 0;
    }
    m_blockAddress = blockAddress;
    m_blockLength = newBlockLength;
}